

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O1

int __thiscall FIX::Initiator::poll(Initiator *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  sockaddr *__addr;
  SessionSettings *pSVar2;
  
  if (this->m_firstPoll == true) {
    this->m_stop = false;
    pSVar2 = &this->m_settings;
    (*this->_vptr_Initiator[2])(this,pSVar2);
    (*this->_vptr_Initiator[3])(this);
    connect(this,(int)pSVar2,__addr,__timeout);
    this->m_firstPoll = false;
  }
  iVar1 = (*this->_vptr_Initiator[5])(this);
  return iVar1;
}

Assistant:

bool Initiator::poll( double timeout ) EXCEPT ( ConfigError, RuntimeError )
{
  if( m_firstPoll )
  {
    m_stop = false;
    onConfigure( m_settings );
    onInitialize( m_settings );
    connect();
    m_firstPoll = false;
  }

  return onPoll( timeout );
}